

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O3

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateTableCreator
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  IdlNamer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  FieldDef *pFVar3;
  IDLOptions *pIVar4;
  CodeWriter *writer_00;
  byte bVar5;
  ostream *poVar6;
  pointer ppFVar7;
  long *plVar8;
  long *plVar9;
  size_type *psVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  uint uVar14;
  pointer ppFVar15;
  bool bVar16;
  bool bVar17;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  string name;
  stringstream params;
  string local_2b0;
  KotlinKMPGenerator *local_290;
  StructDef *local_288;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_280;
  string local_268;
  IDLOptions *local_248;
  CodeWriter *local_240;
  long *local_238;
  ulong local_230;
  long local_228;
  long lStack_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_290 = this;
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&local_280,&(struct_def->fields).vec);
  if (local_280.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_280.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar11 = 0;
    bVar5 = 1;
    ppFVar7 = local_280.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pFVar3 = *ppFVar7;
      if (pFVar3->deprecated == false) {
        if ((pFVar3->value).type.base_type == BASE_TYPE_STRUCT) {
          uVar14 = ((pFVar3->value).type.struct_def)->fixed ^ 1;
          iVar11 = iVar11 + uVar14;
          bVar5 = bVar5 & (byte)uVar14;
        }
        else {
          iVar11 = iVar11 + 1;
        }
      }
      ppFVar7 = ppFVar7 + 1;
    } while (ppFVar7 !=
             local_280.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    if ((bVar5 & (iVar11 < 0x7f && iVar11 != 0)) != 0) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"create","");
      paVar1 = &local_2b0.field_2;
      local_2b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"");
      this_00 = &local_290->namer_;
      IdlNamer::LegacyJavaMethod2(&local_1d8,this_00,(string *)local_1b8,struct_def,&local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      poVar2 = (ostream *)(local_1b8 + 0x10);
      local_288 = struct_def;
      local_248 = options;
      local_240 = writer;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"builder: FlatBufferBuilder",0x1a);
      ppFVar7 = local_280.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppFVar15 = local_280.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppFVar15 != ppFVar7;
          ppFVar15 = ppFVar15 + 1) {
        pFVar3 = *ppFVar15;
        if (pFVar3->deprecated == false) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          (*(this_00->super_Namer)._vptr_Namer[7])(&local_2b0,this_00,pFVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          bVar16 = (pFVar3->value).type.base_type - BASE_TYPE_UTYPE < 0xc;
          pcVar13 = "Offset: ";
          if (bVar16) {
            pcVar13 = ": ";
          }
          lVar12 = 8;
          if (bVar16) {
            lVar12 = 2;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar13,lVar12);
          bVar16 = (pFVar3->value).type.base_type - BASE_TYPE_UTYPE < 0xc;
          bVar17 = pFVar3->presence == kOptional;
          pcVar13 = "";
          if (bVar17 && bVar16) {
            pcVar13 = "?";
          }
          GenType_abi_cxx11_(&local_2b0,local_290,&(pFVar3->value).type);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,pcVar13,(ulong)(bVar17 && bVar16));
          ppFVar7 = local_280.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
            ppFVar7 = local_280.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
      }
      std::__cxx11::stringbuf::str();
      (*(this_00->super_Namer)._vptr_Namer[0xf])(local_1f8,this_00,local_288);
      writer_00 = local_240;
      pIVar4 = local_248;
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x364f02);
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_228 = *plVar9;
        lStack_220 = plVar8[3];
        local_238 = &local_228;
      }
      else {
        local_228 = *plVar9;
        local_238 = (long *)*plVar8;
      }
      local_230 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_238,local_230,0,'\x01');
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_268.field_2._M_allocated_capacity = *psVar10;
        local_268.field_2._8_8_ = plVar8[3];
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      }
      else {
        local_268.field_2._M_allocated_capacity = *psVar10;
        local_268._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_268._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_218._8_8_ = 0;
      local_218._M_unused._M_object = operator_new(0x20);
      *(CodeWriter **)local_218._M_unused._0_8_ = writer_00;
      *(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> **)
       ((long)local_218._M_unused._0_8_ + 8) = &local_280;
      *(KotlinKMPGenerator **)((long)local_218._M_unused._0_8_ + 0x10) = local_290;
      *(StructDef **)((long)local_218._M_unused._0_8_ + 0x18) = local_288;
      local_200 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:948:11)>
                  ::_M_invoke;
      local_208 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:948:11)>
                  ::_M_manager;
      GenerateFun(writer_00,&local_1d8,&local_2b0,&local_268,(function<void_()> *)&local_218,
                  pIVar4->gen_jvmstatic);
      if (local_208 != (code *)0x0) {
        (*local_208)(&local_218,&local_218,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if (local_238 != &local_228) {
        operator_delete(local_238,local_228 + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (local_280.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GenerateTableCreator(StructDef &struct_def, CodeWriter &writer,
                            const IDLOptions options) const {
    // Generate a method that creates a table in one go. This is only possible
    // when the table has no struct fields, since those have to be created
    // inline, and there's no way to do so in Java.
    bool has_no_struct_fields = true;
    int num_fields = 0;
    auto fields_vec = struct_def.fields.vec;

    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (IsStruct(field.value.type)) {
        has_no_struct_fields = false;
      } else {
        num_fields++;
      }
    }
    // JVM specifications restrict default constructor params to be < 255.
    // Longs and doubles take up 2 units, so we set the limit to be < 127.
    if (has_no_struct_fields && num_fields && num_fields < 127) {
      // Generate a table constructor of the form:
      // public static int createName(FlatBufferBuilder builder, args...)

      auto name = namer_.LegacyJavaMethod2("create", struct_def, "");
      std::stringstream params;
      params << "builder: FlatBufferBuilder";
      for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        params << ", " << namer_.Variable(field);
        if (!IsScalar(field.value.type.base_type)) {
          params << "Offset: ";
        } else {
          params << ": ";
        }
        auto optional = field.IsScalarOptional() ? "?" : "";
        params << GenType(field.value.type) << optional;
      }

      GenerateFun(
          writer, name, params.str(), "Offset<" + namer_.Type(struct_def) + '>',
          [&]() {
            writer.SetValue("vec_size", NumToString(fields_vec.size()));
            writer.SetValue("end_method",
                            namer_.Method("end", struct_def.name));
            writer += "builder.startTable({{vec_size}})";

            auto sortbysize = struct_def.sortbysize;
            auto largest = sortbysize ? sizeof(largest_scalar_t) : 1;
            for (size_t size = largest; size; size /= 2) {
              for (auto it = fields_vec.rbegin(); it != fields_vec.rend();
                   ++it) {
                auto &field = **it;
                auto base_type_size = SizeOf(field.value.type.base_type);
                if (!field.deprecated &&
                    (!sortbysize || size == base_type_size)) {
                  writer.SetValue("field_name", namer_.Field(field));

                  // we wrap on null check for scalar optionals
                  writer += field.IsScalarOptional()
                                ? "{{field_name}}?.run { \\"
                                : "\\";

                  writer += namer_.LegacyKotlinMethod("add", field, "") +
                            "(builder, {{field_name}}\\";
                  if (!IsScalar(field.value.type.base_type)) {
                    writer += "Offset\\";
                  }
                  // we wrap on null check for scalar optionals
                  writer += field.IsScalarOptional() ? ") }" : ")";
                }
              }
            }
            writer += "return {{end_method}}(builder)";
          },
          options.gen_jvmstatic);
    }
  }